

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::InnerProduct3D_1D_1D::backward_impl
          (InnerProduct3D_1D_1D *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  int in_R8D;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> b_1;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> A_1;
  array<DimPair,_1> dims2_1;
  array<DimPair,_1> dims_1;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> c_1;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> A;
  array<DimPair,_1> dims2;
  array<DimPair,_1> dims;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> c;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> b;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> tdEdf;
  Tensor *pTVar1;
  undefined1 in_stack_fffffffffffffc80 [16];
  Tensor *in_stack_fffffffffffffc90;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> *in_stack_fffffffffffffc98;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
  *in_stack_fffffffffffffca0;
  TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_0UL>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_0UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>
  *in_stack_fffffffffffffcd8;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_1>
  *in_stack_fffffffffffffce0;
  TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>
  *in_stack_fffffffffffffcf8;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
  *in_stack_fffffffffffffd00;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 local_270;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_268;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_1a0;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_c0;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_b0;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_a0;
  int local_84;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_70;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  local_84 = in_R8D;
  local_70 = in_RSI;
  local_a0 = Tensor::t<1>(in_stack_fffffffffffffc80._0_8_);
  if (local_84 == 0) {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_70,1);
    local_b0 = Tensor::t<1>(in_stack_fffffffffffffc80._0_8_);
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_70,2);
    local_c0 = Tensor::t<1>(in_stack_fffffffffffffc80._0_8_);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,0>::
    contract<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,std::array<Eigen::IndexPair<long>,0ul>>
              ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
                *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc80._8_8_,
               in_stack_fffffffffffffc80._0_8_);
    Eigen::
    TensorBase<Eigen::TensorContractionOp<std::array<Eigen::IndexPair<long>,0ul>const,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>const,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>const,Eigen::NoOpOutputKernel_const>,0>
    ::
    contract<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,std::array<Eigen::IndexPair<long>,0ul>>
              ((TensorBase<Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_0UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_0>
                *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc80._8_8_,
               in_stack_fffffffffffffc80._0_8_);
    Tensor::t<3>(in_stack_fffffffffffffc90);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,1>::
    operator+=(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  else if (local_84 == 1) {
    local_50 = &local_160;
    local_58 = 1;
    local_60 = 0;
    local_160 = 1;
    local_158 = 0;
    local_38 = &local_170;
    local_40 = 0;
    local_48 = 0;
    local_170 = 0;
    local_168 = 0;
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_70,0);
    Tensor::t<3>(in_stack_fffffffffffffc90);
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_70,2);
    local_1a0 = Tensor::t<1>(in_stack_fffffffffffffc80._0_8_);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,0>::
    contract<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,std::array<Eigen::IndexPair<long>,1ul>>
              ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_0>
                *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc80._8_8_,
               in_stack_fffffffffffffc80._0_8_);
    pTVar1 = in_stack_fffffffffffffc80._0_8_;
    Eigen::
    TensorBase<Eigen::TensorContractionOp<std::array<Eigen::IndexPair<long>,1ul>const,Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>const,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>const,Eigen::NoOpOutputKernel_const>,0>
    ::
    contract<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,std::array<Eigen::IndexPair<long>,1ul>>
              ((TensorBase<Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_0>
                *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc80._8_8_,
               (array<Eigen::IndexPair<long>,_1UL> *)pTVar1);
    local_268 = Tensor::t<1>(pTVar1);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1>::
    operator+=(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  }
  else if (local_84 == 2) {
    local_20 = &local_278;
    local_28 = 2;
    local_30 = 0;
    local_278 = 2;
    local_270 = 0;
    local_8 = &local_288;
    local_10 = 0;
    local_18 = 0;
    local_288 = 0;
    local_280 = 0;
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_70,0);
    Tensor::t<3>(in_stack_fffffffffffffc90);
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_70,1);
    Tensor::t<1>(in_stack_fffffffffffffc80._0_8_);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,0>::
    contract<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,std::array<Eigen::IndexPair<long>,1ul>>
              ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_0>
                *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc80._8_8_,
               in_stack_fffffffffffffc80._0_8_);
    pTVar1 = in_stack_fffffffffffffc80._0_8_;
    Eigen::
    TensorBase<Eigen::TensorContractionOp<std::array<Eigen::IndexPair<long>,1ul>const,Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>const,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>const,Eigen::NoOpOutputKernel_const>,0>
    ::
    contract<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,std::array<Eigen::IndexPair<long>,1ul>>
              ((TensorBase<Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_0>
                *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc80._8_8_,
               (array<Eigen::IndexPair<long>,_1UL> *)pTVar1);
    Tensor::t<1>(pTVar1);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1>::
    operator+=(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  }
  else {
    if (local_84 != 3) {
      std::operator<<((ostream *)&std::cerr,"shouldn\'t happen\n");
      abort();
    }
    Tensor::t<1>(in_stack_fffffffffffffc80._0_8_);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1>::
    operator+=(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  }
  return;
}

Assistant:

void InnerProduct3D_1D_1D::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
  auto tdEdf = dEdf.t<1>();  // vector
  typedef Eigen::Tensor<float, 1>::DimensionPair DimPair;
  if (i == 0) { // 3 tensor
    // tensor product
    auto b = xs[1]->t<1>();
    auto c = xs[2]->t<1>();
    dEdxi.t<3>() += tdEdf.contract(c, Eigen::array<DimPair, 0>{{}}).contract(b, Eigen::array<DimPair, 0>{{}});
  } else if (i == 1) { // vector 1
    // TODO these should be reorganized so the contraction is first with tdEdf and then with c or b.
    // in theory, that intermediate result could be cached (although CNN doesn't support this). the fact that it
    // this part of the product is redone when i=1 and again when i=2 is probably why this is slower
    // (or maybe it's the contract implementation?)
    Eigen::array<DimPair, 1> dims({{DimPair(1, 0)}});
    Eigen::array<DimPair, 1> dims2({{DimPair(0, 0)}});
    auto A = xs[0]->t<3>();
    auto c = xs[2]->t<1>();
    dEdxi.t<1>() += A.contract(c, dims).contract(tdEdf, dims2);
  } else if (i == 2) { // vector 2
    Eigen::array<DimPair, 1> dims({{DimPair(2, 0)}});
    Eigen::array<DimPair, 1> dims2({{DimPair(0, 0)}});
    auto A = xs[0]->t<3>();
    auto b = xs[1]->t<1>();
    dEdxi.t<1>() += A.contract(b, dims).contract(tdEdf, dims2);
  } else if (i == 3) { // vector bias
    dEdxi.t<1>() += tdEdf;
  } else {
    cerr << "shouldn't happen\n"; abort();
  }
}